

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

void __thiscall
icu_63::DateTimePatternGenerator::AppendItemFormatsSink::put
          (AppendItemFormatsSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  char *__s2;
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  long lVar3;
  UnicodeString *this_00;
  int i_00;
  undefined **ppuVar4;
  int32_t i;
  ulong uVar5;
  int32_t len;
  ResourceTable itemsTable;
  int32_t local_c4;
  char *local_c0;
  ConstChar16Ptr local_b8;
  AppendItemFormatsSink *local_b0;
  char16_t *local_a8;
  UnicodeString local_98;
  ResourceTable local_58;
  
  local_c0 = key;
  local_b0 = this;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_58,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i_00 = 0;
    while( true ) {
      UVar1 = ResourceTable::getKeyAndValue(&local_58,i_00,&local_c0,value);
      __s2 = local_c0;
      if (UVar1 == '\0') break;
      ppuVar4 = &CLDR_FIELD_APPEND;
      uVar5 = 0;
      do {
        iVar2 = strcmp(*ppuVar4,__s2);
        if (iVar2 == 0) goto LAB_002eed32;
        uVar5 = uVar5 + 1;
        ppuVar4 = ppuVar4 + 1;
      } while (uVar5 != 0x10);
      uVar5 = 0x10;
LAB_002eed32:
      if ((int)uVar5 != 0x10) {
        local_c4 = 0;
        iVar2 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_c4,errorCode);
        local_b8.p_ = (char16_t *)CONCAT44(extraout_var,iVar2);
        icu_63::UnicodeString::UnicodeString(&local_98,'\x01',&local_b8,local_c4);
        local_a8 = local_b8.p_;
        lVar3 = (uVar5 & 0xffffffff) * 0x40;
        if ((*(ushort *)(&local_b0->dtpg->field_0x110 + lVar3) < 0x20) &&
           (0x1f < (ushort)local_98.fUnion.fStackFields.fLengthAndFlags)) {
          this_00 = (UnicodeString *)(&local_b0->dtpg->field_0x108 + lVar3);
          icu_63::UnicodeString::operator=(this_00,&local_98);
          icu_63::UnicodeString::getTerminatedBuffer(this_00);
        }
        icu_63::UnicodeString::~UnicodeString(&local_98);
      }
      i_00 = i_00 + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable itemsTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t i = 0; itemsTable.getKeyAndValue(i, key, value); ++i) {
            UDateTimePatternField field = dtpg.getAppendFormatNumber(key);
            if (field == UDATPG_FIELD_COUNT) { continue; }
            const UnicodeString& valueStr = value.getUnicodeString(errorCode);
            if (dtpg.getAppendItemFormat(field).isEmpty() && !valueStr.isEmpty()) {
                dtpg.setAppendItemFormat(field, valueStr);
            }
        }
    }